

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_mipmaps_image *
rf_load_ktx_image_to_buffer
          (rf_mipmaps_image *__return_storage_ptr__,void *src,rf_int src_size,void *dst,
          rf_int dst_size)

{
  int iVar1;
  _Bool _Var2;
  int *piVar3;
  ulong uVar4;
  undefined1 local_68;
  char acStack_67 [3];
  int image_size;
  rf_ktx_header header;
  rf_int dst_size_local;
  void *dst_local;
  rf_int src_size_local;
  void *src_local;
  
  header._56_8_ = dst_size;
  memset(__return_storage_ptr__,0,0x20);
  if ((src != (void *)0x0) && (0x40 < (ulong)src_size)) {
    memcpy(&local_68,src,0x40);
    piVar3 = (int *)((long)src + (ulong)header.faces + 0x40);
    uVar4 = src_size - ((ulong)header.faces + 0x40);
    _Var2 = rf_match_str_cstr(acStack_67,6,"KTX 11");
    if (_Var2) {
      (__return_storage_ptr__->field_0).image.width = header.gl_internal_format;
      (__return_storage_ptr__->field_0).image.height = header.gl_base_internal_format;
      __return_storage_ptr__->mipmaps = header.elements;
      if (4 < uVar4) {
        iVar1 = *piVar3;
        if (((long)(uVar4 - 4) <= (long)iVar1) && ((long)iVar1 <= (long)header._56_8_)) {
          memcpy(dst,piVar3 + 1,(long)iVar1);
          (__return_storage_ptr__->field_0).image.data = dst;
          if (header.gl_type_size == 0x8d64) {
            (__return_storage_ptr__->field_0).image.format = RF_COMPRESSED_ETC1_RGB;
          }
          else if (header.gl_type_size == 0x9274) {
            (__return_storage_ptr__->field_0).image.format = RF_COMPRESSED_ETC2_RGB;
          }
          else {
            if (header.gl_type_size != 0x9278) {
              return __return_storage_ptr__;
            }
            (__return_storage_ptr__->field_0).image.format = RF_COMPRESSED_ETC2_EAC_RGBA;
          }
          (__return_storage_ptr__->field_0).image.valid = true;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mipmaps_image rf_load_ktx_image_to_buffer(const void* src, rf_int src_size, void* dst, rf_int dst_size)
{
    rf_mipmaps_image result = {0};

    if (src && src_size > sizeof(rf_ktx_header))
    {
        rf_ktx_header header = *(rf_ktx_header*)src;
        src = (char*)src + sizeof(rf_ktx_header) + header.key_value_data_size;
        src_size -= sizeof(rf_ktx_header) + header.key_value_data_size;

        if (rf_match_str_cstr(header.id + 1, 6, "KTX 11"))
        {
            result.width = header.width;
            result.height = header.height;
            result.mipmaps = header.mipmap_levels;

            int image_size = 0;
            if (src_size > sizeof(unsigned int))
            {
                memcpy(&image_size, src, sizeof(unsigned int));
                src = (char*)src + sizeof(unsigned int);
                src_size -= sizeof(unsigned int);

                if (image_size >= src_size && dst_size >= image_size)
                {
                    memcpy(dst, src, image_size);
                    result.data = dst;

                    switch (header.gl_internal_format)
                    {
                        case 0x8D64: result.format = RF_COMPRESSED_ETC1_RGB; break;
                        case 0x9274: result.format = RF_COMPRESSED_ETC2_RGB; break;
                        case 0x9278: result.format = RF_COMPRESSED_ETC2_EAC_RGBA; break;
                        default: return result;
                    }

                    result.valid = true;
                }
            }
        }
    }

    return result;
}